

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

QString * qMakeError(QString *err,ErrorType type,QMYSQLDriverPrivate *p)

{
  int iVar1;
  long in_RCX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QArrayDataPointer<char16_t> local_b0;
  QByteArrayView local_98;
  QArrayDataPointer<char16_t> local_88;
  QStringBuilder<QLatin1String,_const_QString_&> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *cerr;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RCX + 0xa8) == 0) {
    cerr = (char *)0x0;
  }
  else {
    cerr = (char *)mysql_error();
  }
  local_70.a.m_size = 8;
  local_70.a.m_data = "QMYSQL: ";
  local_70.b = (QString *)CONCAT44(in_register_00000034,type);
  QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>((QString *)&local_58,&local_70)
  ;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_98,&cerr);
  QVar2.m_data = (storage_type *)local_98.m_size;
  QVar2.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar2);
  iVar1 = mysql_errno(*(undefined8 *)(in_RCX + 0xa8));
  QString::number((uint)&local_b0,iVar1);
  QSqlError::QSqlError
            ((QSqlError *)err,(QString *)&local_58,(QString *)&local_88,(ErrorType)p,
             (QString *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return err;
  }
  __stack_chk_fail();
}

Assistant:

static QSqlError qMakeError(const QString &err, QSqlError::ErrorType type,
                            const QMYSQLDriverPrivate *p)
{
    const char *cerr = p->mysql ? mysql_error(p->mysql) : nullptr;
    return QSqlError("QMYSQL: "_L1 + err,
                     QString::fromUtf8(cerr),
                     type, QString::number(mysql_errno(p->mysql)));
}